

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

void accumulate_weighted_avg(vw *all,parameters *weights)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  sparse_parameters *this;
  weight *pwVar4;
  ostream *this_00;
  float *buffer;
  byte *in_RSI;
  vw *in_RDI;
  uint64_t i_1;
  uint64_t i;
  float *local_weights;
  uint32_t length;
  parameters *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  vw *in_stack_ffffffffffffffa0;
  sparse_parameters *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffb0;
  dense_parameters *in_stack_ffffffffffffffb8;
  vw *in_stack_ffffffffffffffc0;
  vw *pvVar5;
  float *local_30;
  vw *i_00;
  
  if ((in_RDI->adaptive & 1U) == 0) {
    std::operator<<(&(in_RDI->trace_message).super_ostream,
                    "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n"
                   );
  }
  else {
    uVar1 = 1 << ((byte)in_RDI->num_bits & 0x1f);
    uVar3 = SUB168(ZEXT416(uVar1) * ZEXT816(4),0);
    if (SUB168(ZEXT416(uVar1) * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    this = (sparse_parameters *)operator_new__(uVar3);
    if ((*in_RSI & 1) == 0) {
      for (local_30 = (float *)0x0; local_30 < (float *)(ulong)uVar1;
          local_30 = (float *)((long)local_30 + 1)) {
        in_stack_ffffffffffffffb8 = (dense_parameters *)(in_RSI + 8);
        in_stack_ffffffffffffffb0 = local_30;
        uVar2 = dense_parameters::stride_shift((dense_parameters *)(in_RSI + 8));
        pwVar4 = dense_parameters::operator[]
                           (in_stack_ffffffffffffffb8,
                            (long)in_stack_ffffffffffffffb0 << ((byte)uVar2 & 0x3f));
        *(weight *)((long)&(this->_map)._M_h._M_buckets + (long)local_30 * 4) = pwVar4[1];
      }
    }
    else {
      pvVar5 = (vw *)0x0;
      while (pvVar5 < (vw *)(ulong)uVar1) {
        i_00 = pvVar5;
        sparse_parameters::stride_shift((sparse_parameters *)(in_RSI + 0x20));
        pwVar4 = sparse_parameters::operator[](this,(size_t)i_00);
        *(weight *)((long)&(this->_map)._M_h._M_buckets + (long)i_00 * 4) = pwVar4[1];
        in_stack_ffffffffffffffc0 = pvVar5;
        pvVar5 = (vw *)((long)&i_00->sd + 1);
      }
    }
    all_reduce<float,_&add_float>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if ((*in_RSI & 1) == 0) {
      do_weighting<dense_parameters>
                (in_stack_ffffffffffffffc0,(uint64_t)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0,(dense_parameters *)in_stack_ffffffffffffffa8);
    }
    else {
      do_weighting<sparse_parameters>
                (in_stack_ffffffffffffffc0,(uint64_t)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    if ((*in_RSI & 1) == 0) {
      dense_parameters::first((dense_parameters *)(in_RSI + 8));
      buffer = (float *)(ulong)uVar1;
      parameters::stride_shift(in_stack_ffffffffffffff88);
      all_reduce<float,_&add_float>(in_RDI,buffer,in_stack_ffffffffffffff90);
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,
                                "sparse parameters not supported with parallel computation!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    if (this != (sparse_parameters *)0x0) {
      operator_delete__(this);
    }
  }
  return;
}

Assistant:

void accumulate_weighted_avg(vw& all, parameters& weights)
{
  if (!all.adaptive)
  {
    all.trace_message << "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n";
    return;
  }
  uint32_t length = 1 << all.num_bits;  // This is the number of parameters
  float* local_weights = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[1];
  else
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[1];

  // First compute weights for averaging
  all_reduce<float, add_float>(all, local_weights, length);

  if (weights.sparse)
    do_weighting(all, length, local_weights, weights.sparse_weights);
  else
    do_weighting(all, length, local_weights, weights.dense_weights);

  if (weights.sparse)
    cout << "sparse parameters not supported with parallel computation!" << endl;
  else
    all_reduce<float, add_float>(all, weights.dense_weights.first(), ((size_t)length) * (1 << weights.stride_shift()));
  delete[] local_weights;
}